

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O2

uint32_t icu_63::setWeightByte(uint32_t weight,int32_t idx,uint32_t byte)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (idx < 4) {
    uVar2 = 0xffffffff >> ((char)idx * '\b' & 0x1fU);
  }
  bVar1 = (char)idx * -8;
  return (-0x100 << (bVar1 & 0x1f) | uVar2) & weight | byte << (bVar1 & 0x1f);
}

Assistant:

static inline uint32_t
setWeightByte(uint32_t weight, int32_t idx, uint32_t byte) {
    uint32_t mask; /* 0xffffffff except a 00 "hole" for the index-th byte */

    idx*=8;
    if(idx<32) {
        mask=((uint32_t)0xffffffff)>>idx;
    } else {
        // Do not use uint32_t>>32 because on some platforms that does not shift at all
        // while we need it to become 0.
        // PowerPC: 0xffffffff>>32 = 0           (wanted)
        // x86:     0xffffffff>>32 = 0xffffffff  (not wanted)
        //
        // ANSI C99 6.5.7 Bitwise shift operators:
        // "If the value of the right operand is negative
        // or is greater than or equal to the width of the promoted left operand,
        // the behavior is undefined."
        mask=0;
    }
    idx=32-idx;
    mask|=0xffffff00<<idx;
    return (uint32_t)((weight&mask)|(byte<<idx));
}